

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O3

void __thiscall testing::internal::linked_ptr<InotifyEvent>::depart(linked_ptr<InotifyEvent> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InotifyEvent *pIVar2;
  pointer pcVar3;
  bool bVar4;
  
  bVar4 = linked_ptr_internal::depart(&this->link_);
  if (bVar4) {
    pIVar2 = this->value_;
    if (pIVar2 != (InotifyEvent *)0x0) {
      pcVar3 = (pIVar2->path)._M_dataplus._M_p;
      paVar1 = &(pIVar2->path).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pIVar2,0x28);
    return;
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }